

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arbitrary.cpp
# Opt level: O0

bool __thiscall Arbitraryvector::Run(Arbitraryvector *this)

{
  pointer *__return_storage_ptr__;
  size_type sVar1;
  reference pvVar2;
  size_type sVar3;
  size_type sVar4;
  bool local_61;
  undefined1 local_48 [8];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  vv;
  vector<int,_std::allocator<int>_> v;
  Arbitrary<std::vector<int,_std::allocator<int>_>_> a;
  Arbitraryvector *this_local;
  
  __return_storage_ptr__ =
       &vv.
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage;
  testinator::anon_unknown_6::Arbitrary_RandomSequence<std::vector<int,_std::allocator<int>_>_>::
  generate((vector<int,_std::allocator<int>_> *)__return_storage_ptr__,1,0);
  testinator::anon_unknown_6::Arbitrary_RandomSequence<std::vector<int,_std::allocator<int>_>_>::
  shrink((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *)local_48,(vector<int,_std::allocator<int>_> *)__return_storage_ptr__);
  sVar1 = std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::size((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  *)local_48);
  local_61 = false;
  if (sVar1 == 2) {
    pvVar2 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           *)local_48,0);
    sVar1 = std::vector<int,_std::allocator<int>_>::size(pvVar2);
    pvVar2 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           *)local_48,1);
    sVar3 = std::vector<int,_std::allocator<int>_>::size(pvVar2);
    sVar4 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)
                       &vv.
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_61 = sVar1 + sVar3 == sVar4;
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)local_48);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &vv.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return local_61;
}

Assistant:

DEF_TEST(vector, Arbitrary)
{
  testinator::Arbitrary<vector<int>> a;
  vector<int> v = a.generate(1,0);
  vector<vector<int>> vv = a.shrink(v);
  return vv.size() == 2
    && vv[0].size() + vv[1].size() == v.size();
}